

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O0

void * metacallfms_await(void *func,char *buffer,size_t size,void *allocator,
                        _func_void_ptr_void_ptr_void_ptr *resolve_callback,
                        _func_void_ptr_void_ptr_void_ptr *reject_callback,void *data)

{
  type_id tVar1;
  type_id tVar2;
  int iVar3;
  size_t sVar4;
  value pvVar5;
  void *pvVar6;
  void **ppvVar7;
  void **ppvVar8;
  value *ppvVar9;
  type t_00;
  long in_RDX;
  long in_RSI;
  function_conflict in_RDI;
  value cast_ret_1;
  type_id id_1;
  type t_1;
  value *v_element;
  value element;
  size_t args_count;
  size_t iterator;
  value v;
  value ret_1;
  value *v_map;
  void *values [16];
  void *keys [16];
  value cast_ret;
  type_id id;
  type t;
  value ret;
  signature s;
  function f;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  void *in_stack_fffffffffffffe30;
  function_reject_callback in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  size_t in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  function_conflict in_stack_fffffffffffffe58;
  value *in_stack_fffffffffffffe60;
  void **in_stack_fffffffffffffe68;
  void **keys_00;
  function_return local_178;
  undefined8 local_168;
  undefined4 in_stack_fffffffffffffea0;
  type_id in_stack_fffffffffffffea4;
  value in_stack_fffffffffffffea8;
  value in_stack_fffffffffffffeb8;
  undefined8 local_e8 [17];
  type_id local_5c;
  type local_58;
  function_return local_50;
  signature local_48;
  long local_20;
  long local_18;
  function_return local_8;
  
  if (in_RDI == (function_conflict)0x0) {
    local_8 = (function_return)0x0;
  }
  else {
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_48 = function_signature(in_RDI);
    if ((local_18 == 0) || (local_20 == 0)) {
      sVar4 = signature_count(local_48);
      if (sVar4 == 0) {
        local_50 = function_await(in_stack_fffffffffffffe58,
                                  (void **)CONCAT44(in_stack_fffffffffffffe54,
                                                    in_stack_fffffffffffffe50),
                                  in_stack_fffffffffffffe48,
                                  (function_resolve_callback)
                                  CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                  in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
        if ((local_50 != (function_return)0x0) &&
           (local_58 = signature_get_return(local_48), local_58 != (type)0x0)) {
          tVar1 = type_index(local_58);
          local_5c = tVar1;
          tVar2 = value_type_id((value)CONCAT44(tVar1,in_stack_fffffffffffffe40));
          if (tVar1 != tVar2) {
            pvVar5 = value_type_cast(in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
            if (pvVar5 != (value)0x0) {
              return pvVar5;
            }
            return local_50;
          }
        }
        local_8 = local_50;
      }
      else {
        local_8 = (function_return)0x0;
      }
    }
    else {
      metacall_serial();
      pvVar6 = metacall_deserialize
                         ((char *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                          (char *)in_stack_fffffffffffffe38,(size_t)in_stack_fffffffffffffe30,
                          (void *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      if (pvVar6 == (void *)0x0) {
        local_8 = (function_return)0x0;
      }
      else {
        tVar1 = value_type_id((value)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
        iVar3 = type_id_map(tVar1);
        if (iVar3 == 0) {
          ppvVar7 = (void **)signature_count(local_48);
          keys_00 = ppvVar7;
          ppvVar8 = (void **)value_type_count((void *)CONCAT44(in_stack_fffffffffffffe2c,
                                                               in_stack_fffffffffffffe28));
          if (ppvVar7 == ppvVar8) {
            ppvVar9 = value_to_map((value)0x139520);
            for (ppvVar7 = (void **)0x0; ppvVar7 < keys_00; ppvVar7 = (void **)((long)ppvVar7 + 1))
            {
              in_stack_fffffffffffffe68 = (void **)ppvVar9[(long)ppvVar7];
              in_stack_fffffffffffffe60 = value_to_array((value)0x139557);
              pvVar5 = value_type_copy(in_stack_fffffffffffffeb8);
              local_e8[(long)ppvVar7] = pvVar5;
              pvVar5 = value_type_copy(in_stack_fffffffffffffeb8);
              (&local_168)[(long)ppvVar7] = pvVar5;
            }
            local_178 = metacallfmv_await(ppvVar7,keys_00,in_stack_fffffffffffffe68,
                                          (_func_void_ptr_void_ptr_void_ptr *)
                                          in_stack_fffffffffffffe60,
                                          (_func_void_ptr_void_ptr_void_ptr *)
                                          in_stack_fffffffffffffe58,
                                          (void *)CONCAT44(in_stack_fffffffffffffe54,
                                                           in_stack_fffffffffffffe50));
            for (ppvVar7 = (void **)0x0; ppvVar7 < keys_00; ppvVar7 = (void **)((long)ppvVar7 + 1))
            {
              value_type_destroy((value)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0
                                                ));
              value_type_destroy((value)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0
                                                ));
            }
            value_type_destroy((value)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0))
            ;
            if ((local_178 != (void *)0x0) &&
               (t_00 = signature_get_return(local_48), t_00 != (type)0x0)) {
              tVar1 = type_index(t_00);
              tVar2 = value_type_id((value)CONCAT44(in_stack_fffffffffffffe44,
                                                    in_stack_fffffffffffffe40));
              if ((tVar1 != tVar2) &&
                 (pvVar5 = value_type_cast(in_stack_fffffffffffffea8,in_stack_fffffffffffffea4),
                 pvVar5 != (value)0x0)) {
                local_178 = pvVar5;
              }
            }
            local_8 = local_178;
          }
          else {
            value_type_destroy((value)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0))
            ;
            local_8 = (function_return)0x0;
          }
        }
        else {
          value_type_destroy((value)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
          local_8 = (function_return)0x0;
        }
      }
    }
  }
  return local_8;
}

Assistant:

void *metacallfms_await(void *func, const char *buffer, size_t size, void *allocator, void *(*resolve_callback)(void *, void *), void *(*reject_callback)(void *, void *), void *data)
{
	function f = (function)func;

	if (f != NULL)
	{
		signature s = function_signature(f);

		if (buffer == NULL || size == 0)
		{
			if (signature_count(s) == 0)
			{
				value ret = function_await(f, metacall_null_args, 0, resolve_callback, reject_callback, data);

				if (ret != NULL)
				{
					type t = signature_get_return(s);

					if (t != NULL)
					{
						type_id id = type_index(t);

						if (id != value_type_id(ret))
						{
							value cast_ret = value_type_cast(ret, id);

							return (cast_ret == NULL) ? ret : cast_ret;
						}
					}
				}

				return ret;
			}

			return NULL;
		}
		else
		{
			void *keys[METACALL_ARGS_SIZE];
			void *values[METACALL_ARGS_SIZE];

			value *v_map, ret, v = (value)metacall_deserialize(metacall_serial(), buffer, size, allocator);

			size_t iterator, args_count;

			if (v == NULL)
			{
				return NULL;
			}

			if (type_id_map(value_type_id(v)) != 0)
			{
				value_type_destroy(v);

				return NULL;
			}

			args_count = signature_count(s);

			/* TODO: No optional arguments allowed, review in the future */
			if (args_count != value_type_count(v))
			{
				value_type_destroy(v);

				return NULL;
			}

			v_map = value_to_map(v);

			for (iterator = 0; iterator < args_count; ++iterator)
			{
				value element = v_map[iterator];
				value *v_element = value_to_array(element);

				/* This step is necessary in order to handle type castings */
				keys[iterator] = value_type_copy(v_element[0]);
				values[iterator] = value_type_copy(v_element[1]);
			}

			ret = metacallfmv_await(f, keys, values, resolve_callback, reject_callback, data);

			/* This step is necessary in order to handle type castings (otherwise it generates leaks) */
			for (iterator = 0; iterator < args_count; ++iterator)
			{
				value_type_destroy(keys[iterator]);
				value_type_destroy(values[iterator]);
			}

			value_type_destroy(v);

			if (ret != NULL)
			{
				type t = signature_get_return(s);

				if (t != NULL)
				{
					type_id id = type_index(t);

					if (id != value_type_id(ret))
					{
						value cast_ret = value_type_cast(ret, id);

						if (cast_ret != NULL)
						{
							ret = cast_ret;
						}
					}
				}
			}

			return ret;
		}
	}

	return NULL;
}